

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_layer.cpp
# Opt level: O3

void __thiscall
neural_networks::utilities::NeuralLayer::NeuralLayer(NeuralLayer *this,NeuralLayer *other)

{
  Matrix<long_double> *pMVar1;
  size_t sVar2;
  NeuralMatrix *this_00;
  Matrix<long_double> *pMVar3;
  
  this->_vptr_NeuralLayer = (_func_int **)&PTR_update_0010bbc0;
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  this->N = other->N;
  this_00 = (NeuralMatrix *)operator_new(0x30);
  NeuralMatrix::NeuralMatrix
            (this_00,(other->data->super_Matrix<neural_networks::utilities::Neuron_*>).N,1,false,
             false);
  this->data = this_00;
  if (other->weights != (Matrix<long_double> *)0x0) {
    pMVar3 = (Matrix<long_double> *)operator_new(0x30);
    pMVar1 = other->bias;
    pMVar3->_vptr_Matrix = (_func_int **)&PTR_valid_0010bbe8;
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::vector(&pMVar3->matrix,&pMVar1->matrix);
    sVar2 = pMVar1->M;
    pMVar3->N = pMVar1->N;
    pMVar3->M = sVar2;
    this->bias = pMVar3;
    pMVar3 = (Matrix<long_double> *)operator_new(0x30);
    pMVar1 = other->weights;
    pMVar3->_vptr_Matrix = (_func_int **)&PTR_valid_0010bbe8;
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::vector(&pMVar3->matrix,&pMVar1->matrix);
    sVar2 = pMVar1->M;
    pMVar3->N = pMVar1->N;
    pMVar3->M = sVar2;
    this->weights = pMVar3;
  }
  return;
}

Assistant:

NeuralLayer::NeuralLayer(const NeuralLayer &other) : N(other.N) {
    // N should be the same for each matrix
    data = new NeuralMatrix(other.data -> N, 1);
    // this is only in the case of the input matrix, which has no weight or bias matrix
    if(!other.weights) {
        return;
    }
    // Matrix copy constructor should be copying not replacing
    bias = new Matrix<long double>(*other.bias); // for all the matrices
    weights = new Matrix<long double>(*other.weights);
}